

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SaturationAlgorithm.cpp
# Opt level: O0

UnitList * __thiscall
Saturation::SaturationAlgorithm::collectSaturatedSet(SaturationAlgorithm *this)

{
  bool bVar1;
  Clause *cl;
  ClauseIterator it;
  UnitList *res;
  List<Kernel::Unit_*> **in_stack_ffffffffffffffb8;
  Clause *in_stack_ffffffffffffffc0;
  ActiveClauseContainer *in_stack_ffffffffffffffd8;
  undefined8 local_10;
  
  local_10 = (UnitList *)0x0;
  ActiveClauseContainer::clauses(in_stack_ffffffffffffffd8);
  while( true ) {
    bVar1 = Lib::VirtualIterator<Kernel::Clause_*>::hasNext
                      ((VirtualIterator<Kernel::Clause_*> *)0xad1d22);
    if (!bVar1) break;
    in_stack_ffffffffffffffc0 =
         Lib::VirtualIterator<Kernel::Clause_*>::next((VirtualIterator<Kernel::Clause_*> *)0xad1d3c)
    ;
    Kernel::Clause::incRefCnt(in_stack_ffffffffffffffc0);
    Lib::List<Kernel::Unit_*>::push
              (&in_stack_ffffffffffffffc0->super_Unit,in_stack_ffffffffffffffb8);
  }
  Lib::VirtualIterator<Kernel::Clause_*>::~VirtualIterator
            ((VirtualIterator<Kernel::Clause_*> *)in_stack_ffffffffffffffc0);
  return local_10;
}

Assistant:

UnitList *SaturationAlgorithm::collectSaturatedSet()
{
  UnitList* res = 0;
  ClauseIterator it = _active->clauses();
  while (it.hasNext()) {
    Clause* cl = it.next();
    cl->incRefCnt();
    UnitList::push(cl, res);
  }
  return res;
}